

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cc
# Opt level: O3

Player * Player::create(Player_Type pt,uint sample_rate)

{
  int iVar1;
  Player *pPVar2;
  undefined **ppuVar3;
  
  if (pt == OPL3) {
    ppuVar3 = &PTR_init_002182b0;
  }
  else {
    if (pt != OPN2) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/sources/player.cc"
                    ,0xf,"static Player *Player::create(Player_Type, unsigned int)");
    }
    ppuVar3 = &PTR_init_002183c8;
  }
  pPVar2 = (Player *)operator_new(0x48);
  pPVar2->sample_rate_ = 0;
  pPVar2->emulator_ = 0;
  pPVar2->chanalloc_ = 0;
  (pPVar2->mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(pPVar2->mutex_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(pPVar2->mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (pPVar2->mutex_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0
  ;
  (pPVar2->mutex_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0
  ;
  pPVar2[1]._vptr_Player = (_func_int **)0x0;
  pPVar2->_vptr_Player = (_func_int **)ppuVar3;
  iVar1 = (*(code *)*ppuVar3)(pPVar2,sample_rate);
  if ((char)iVar1 == '\0') {
    (*pPVar2->_vptr_Player[2])(pPVar2);
    pPVar2 = (Player *)0x0;
  }
  return pPVar2;
}

Assistant:

Player *Player::create(Player_Type pt, unsigned sample_rate)
{
    std::unique_ptr<Player> instance;
    switch (pt) {
    default: assert(false); abort();
    #define PLAYER_CASE(x)                                                  \
        case Player_Type::x: instance.reset(new Generic_Player<Player_Type::x>); break;
    EACH_PLAYER_TYPE(PLAYER_CASE);
    #undef PLAYER_CASE
    }
    if (!instance->init(sample_rate))
        return nullptr;
    return instance.release();
}